

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

int fy_token_format_text_length(fy_token *fyt)

{
  int iVar1;
  
  if (fyt == (fy_token *)0x0) {
    return 0;
  }
  if (fyt->type != FYTT_TAG_DIRECTIVE) {
    if (fyt->type != FYTT_TAG) {
      iVar1 = fy_atom_format_text_length(&fyt->handle);
      return iVar1;
    }
    iVar1 = fy_tag_token_format_text_length(fyt);
    return iVar1;
  }
  iVar1 = fy_tag_directive_token_format_text_length(fyt);
  return iVar1;
}

Assistant:

int fy_token_format_text_length(struct fy_token *fyt) {
    int length;

    if (!fyt)
        return 0;

    switch (fyt->type) {

        case FYTT_TAG:
            return fy_tag_token_format_text_length(fyt);

        case FYTT_TAG_DIRECTIVE:
            return fy_tag_directive_token_format_text_length(fyt);

        default:
            break;
    }

    length = fy_atom_format_text_length(&fyt->handle);

    return length;
}